

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_pack4to8.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_pack4to8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *kernel,Mat *_bias,int kernel_w,int kernel_h,
               int dilation_w,int dilation_h,int stride_w,int stride_h,Option *opt)

{
  long in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  int in_stack_00000008;
  int in_stack_00000010;
  int in_stack_00000018;
  int in_stack_00000020;
  long in_stack_00000028;
  __m128 _val;
  int j;
  int i;
  float *sptr;
  int v;
  int u;
  float *ptr;
  Mat img;
  int p;
  int gap;
  Mat bottom_im2col;
  int maxk;
  int size;
  int outh;
  int outw;
  int inch;
  int w;
  Mat *m_1;
  Mat *m;
  Option *in_stack_00000848;
  Mat *in_stack_00000850;
  Mat *in_stack_00000858;
  Mat *in_stack_00000860;
  Mat *in_stack_00000868;
  undefined8 in_stack_fffffffffffffc10;
  size_t in_stack_fffffffffffffc18;
  undefined8 in_stack_fffffffffffffc20;
  undefined8 in_stack_fffffffffffffc28;
  Mat *in_stack_fffffffffffffc30;
  int local_380;
  int local_37c;
  undefined8 *local_378;
  undefined4 in_stack_fffffffffffffc90;
  int iVar1;
  undefined4 in_stack_fffffffffffffc94;
  int iVar2;
  undefined8 local_368;
  undefined8 local_360;
  undefined8 local_358;
  undefined4 local_350;
  long *local_348;
  undefined4 local_340;
  undefined4 local_33c;
  undefined4 local_338;
  undefined4 local_334;
  undefined4 local_330;
  undefined8 local_328;
  undefined8 *local_320;
  undefined8 local_308;
  undefined8 local_300;
  undefined8 local_2f8;
  undefined4 local_2f0;
  long local_2e8;
  undefined4 local_2e0;
  undefined4 local_2dc;
  undefined4 local_2d8;
  undefined4 local_2d4;
  undefined4 local_2d0;
  undefined8 local_2c8;
  int local_2c0;
  int local_2bc;
  void *local_2b8;
  int *local_2b0;
  long local_2a8;
  undefined4 local_2a0;
  long *local_298;
  undefined4 local_290;
  int local_28c;
  int local_288;
  undefined4 local_284;
  undefined4 local_280;
  long local_278;
  int local_270;
  int local_26c;
  int local_268;
  int local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  long *local_238;
  undefined8 *local_230;
  undefined8 *local_220;
  void **local_210;
  int local_1f0;
  undefined4 local_1ec;
  void **local_1e8;
  undefined8 *local_1c8;
  undefined8 *local_1a8;
  undefined1 local_19d;
  int local_19c;
  void **local_198;
  undefined8 *local_190;
  undefined8 *local_170;
  int local_164;
  undefined8 *local_160;
  undefined1 local_155;
  int local_154;
  undefined8 *local_148;
  void *local_f8;
  undefined8 local_e8;
  undefined4 local_dc;
  undefined8 local_d8;
  int local_cc;
  int local_c8;
  int local_c4;
  void **local_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  undefined8 *local_a0;
  undefined8 *local_98;
  long local_90;
  undefined4 local_84;
  long local_80;
  long local_78;
  undefined4 local_6c;
  int local_68;
  int local_64;
  undefined8 *local_60;
  long *local_58;
  undefined4 local_4c;
  long local_48;
  undefined8 *local_40;
  undefined4 local_34;
  int local_30;
  int local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  long local_8;
  
  local_25c = *(int *)((long)in_RDI + 0x2c);
  local_260 = (int)in_RDI[7];
  local_264 = *(int *)(in_RSI + 0x2c);
  local_268 = *(int *)(in_RSI + 0x30);
  local_26c = local_264 * local_268;
  local_270 = in_R8D * in_R9D;
  local_e8 = *(undefined8 *)(in_stack_00000028 + 0x10);
  local_c0 = &local_2b8;
  local_d8 = 0x10;
  local_dc = 4;
  local_2b8 = (void *)0x0;
  local_2b0 = (int *)0x0;
  local_2a8 = 0;
  local_2a0 = 0;
  local_298 = (long *)0x0;
  local_290 = 0;
  local_28c = 0;
  local_288 = 0;
  local_284 = 0;
  local_280 = 0;
  local_278 = 0;
  local_258 = in_R9D;
  local_254 = in_R8D;
  local_238 = in_RDI;
  local_cc = local_260;
  local_c8 = local_270;
  local_c4 = local_26c;
  Mat::create(in_stack_fffffffffffffc30,(int)((ulong)in_stack_fffffffffffffc28 >> 0x20),
              (int)in_stack_fffffffffffffc28,(int)((ulong)in_stack_fffffffffffffc20 >> 0x20),
              in_stack_fffffffffffffc18,(int)((ulong)in_stack_fffffffffffffc10 >> 0x20),
              (Allocator *)CONCAT44(in_stack_fffffffffffffc94,in_stack_fffffffffffffc90));
  local_2bc = (local_25c * in_stack_00000020 - local_264 * in_stack_00000018) * 4;
  for (local_2c0 = 0; local_2c0 < local_260; local_2c0 = local_2c0 + 1) {
    local_148 = &local_308;
    local_64 = *(int *)((long)local_238 + 0x2c);
    local_68 = (int)local_238[6];
    local_6c = *(undefined4 *)((long)local_238 + 0x34);
    local_78 = *local_238 + local_238[8] * (long)local_2c0 * local_238[2];
    local_80 = local_238[2];
    local_84 = (undefined4)local_238[3];
    local_90 = local_238[4];
    local_60 = &local_308;
    local_8 = (long)local_64 * (long)local_68 * local_80;
    local_190 = &local_368;
    local_198 = &local_2b8;
    local_40 = (undefined8 *)((long)local_2b8 + local_278 * local_2c0 * local_2a8);
    local_28 = &local_368;
    local_18 = (long)local_28c * (long)local_288 * local_2a8;
    local_170 = &local_368;
    local_230 = &local_368;
    local_348 = local_298;
    local_368 = 0;
    local_358 = 0;
    local_350 = 0;
    local_340 = 0;
    local_33c = 0;
    local_338 = 0;
    local_334 = 0;
    local_330 = 0;
    local_328 = 0;
    local_360 = 0;
    local_320 = local_40;
    for (iVar2 = 0; iVar2 < local_258; iVar2 = iVar2 + 1) {
      for (iVar1 = 0; iVar1 < local_254; iVar1 = iVar1 + 1) {
        local_164 = in_stack_00000010 * iVar2;
        local_160 = &local_308;
        local_378 = (undefined8 *)
                    (local_78 + (long)local_64 * (long)local_164 * local_80 +
                    (long)(in_stack_00000008 * iVar1 * 4) * 4);
        for (local_37c = 0; local_37c < local_268; local_37c = local_37c + 1) {
          for (local_380 = 0; local_380 < local_264; local_380 = local_380 + 1) {
            local_98 = local_378;
            local_b8 = *local_378;
            uStack_b0 = local_378[1];
            local_a0 = local_320;
            *local_320 = local_b8;
            local_320[1] = uStack_b0;
            local_378 = (undefined8 *)((long)local_378 + (long)(in_stack_00000018 << 2) * 4);
            local_320 = local_320 + 2;
          }
          local_378 = (undefined8 *)((long)local_378 + (long)local_2bc * 4);
        }
      }
    }
    local_220 = &local_308;
    local_c = 0x10;
    local_1c = 0x10;
    local_2c = local_28c;
    local_30 = local_288;
    local_34 = local_284;
    local_48 = local_2a8;
    local_4c = local_2a0;
    local_58 = local_298;
    local_154 = local_2c0;
    local_155 = 1;
    local_19c = local_2c0;
    local_19d = 1;
    local_308 = 0;
    local_2f8 = 0;
    local_2f0 = 0;
    local_2e0 = 0;
    local_2dc = 0;
    local_2d8 = 0;
    local_2d4 = 0;
    local_2d0 = 0;
    local_2c8 = 0;
    local_300 = 0;
    local_1c8 = local_220;
    local_1a8 = local_230;
    local_2e8 = local_90;
  }
  im2col_sgemm_pack4to8_avx
            (in_stack_00000868,in_stack_00000860,in_stack_00000858,in_stack_00000850,
             in_stack_00000848);
  local_210 = &local_2b8;
  if (local_2b0 != (int *)0x0) {
    local_1ec = 0xffffffff;
    LOCK();
    local_1f0 = *local_2b0;
    *local_2b0 = *local_2b0 + -1;
    UNLOCK();
    if (local_1f0 == 1) {
      local_1e8 = local_210;
      if (local_298 == (long *)0x0) {
        local_f8 = local_2b8;
        if (local_2b8 != (void *)0x0) {
          free(local_2b8);
        }
      }
      else {
        (**(code **)(*local_298 + 0x18))(local_298,local_2b8);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_pack4to8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& kernel, const Mat& _bias, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, const Option& opt)
{
    int w = bottom_blob.w;
    int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    const int size = outw * outh;

    const int maxk = kernel_w * kernel_h;

    // im2col
    Mat bottom_im2col(size, maxk, inch, 16u, 4, opt.workspace_allocator);
    {
        const int gap = (w * stride_h - outw * stride_w) * 4;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int p = 0; p < inch; p++)
        {
            const Mat img = bottom_blob.channel(p);
            float* ptr = bottom_im2col.channel(p);

            for (int u = 0; u < kernel_h; u++)
            {
                for (int v = 0; v < kernel_w; v++)
                {
                    const float* sptr = img.row(dilation_h * u) + dilation_w * v * 4;

                    for (int i = 0; i < outh; i++)
                    {
                        int j = 0;
                        for (; j < outw; j++)
                        {
                            __m128 _val = _mm_load_ps(sptr);
                            _mm_store_ps(ptr, _val);

                            sptr += stride_w * 4;
                            ptr += 4;
                        }

                        sptr += gap;
                    }
                }
            }
        }
    }

    im2col_sgemm_pack4to8_avx(bottom_im2col, top_blob, kernel, _bias, opt);
}